

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O2

void __thiscall MinVR::VRDataQueue::push(VRDataQueue *this,VRDataIndex *event)

{
  VRDataIndex *this_00;
  longlong timeStamp;
  VRDataIndex *this_01;
  undefined1 auStack_48 [40];
  
  this_00 = (VRDataIndex *)operator_new(0x98);
  this_01 = this_00;
  VRDataIndex::VRDataIndex(this_00,event);
  timeStamp = makeTimeStamp((VRDataQueue *)this_01);
  VRDataQueueItem::VRDataQueueItem((VRDataQueueItem *)auStack_48,this_00);
  push(this,timeStamp,(VRDataQueueItem *)auStack_48);
  std::__cxx11::string::~string((string *)(auStack_48 + 8));
  return;
}

Assistant:

void VRDataQueue::push(const VRDataIndex event) {
  VRDataIndex* eventPtr = new VRDataIndex(event);
  push(makeTimeStamp(), VRDataQueueItem(eventPtr));
}